

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

bool __thiscall
duckdb::PipelineExecutor::TryFlushCachingOperators
          (PipelineExecutor *this,ExecutionBudget *chunk_budget)

{
  Pipeline *pPVar1;
  PhysicalOperator *op;
  OperatorResultType value;
  int iVar2;
  reference pvVar3;
  reference this_00;
  optional_ptr<duckdb::DataChunk,_true> chunk;
  type pGVar4;
  reference this_01;
  type pOVar5;
  InternalException *this_02;
  size_type __n;
  PhysicalOperator *op_00;
  ulong __n_00;
  bool bVar6;
  string local_70;
  string local_50;
  
  if (this->started_flushing == true) {
    __n_00 = this->flushing_idx;
  }
  else {
    this->started_flushing = true;
    __n_00 = 0;
    if (0 < this->finished_processing_idx) {
      __n_00 = (ulong)(uint)this->finished_processing_idx;
    }
    this->flushing_idx = __n_00;
  }
  pPVar1 = this->pipeline;
  if (__n_00 < (ulong)((long)(pPVar1->operators).
                             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar1->operators).
                             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    do {
      pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                         (&pPVar1->operators,__n_00);
      iVar2 = (*pvVar3->_M_data->_vptr_PhysicalOperator[0xd])();
      if ((char)iVar2 == '\0') {
LAB_00549d13:
        __n_00 = this->flushing_idx + 1;
        this->flushing_idx = __n_00;
      }
      else {
        if ((this->should_flush_current_idx == false) &&
           ((this->in_process_operators).c.
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (this->in_process_operators).c.
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur)) {
          this->should_flush_current_idx = true;
          goto LAB_00549d13;
        }
        __n = this->flushing_idx;
        chunk.ptr = &this->final_chunk;
        if (__n + 1 < (ulong)((long)(this->intermediate_chunks).
                                    super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->intermediate_chunks).
                                    super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          this_00 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                    ::operator[](&this->intermediate_chunks,__n + 1);
          chunk.ptr = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                      operator*(this_00);
          __n = this->flushing_idx;
        }
        pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                           (&this->pipeline->operators,__n);
        if ((this->in_process_operators).c.
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (this->in_process_operators).c.
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) {
          op = pvVar3->_M_data;
          DataChunk::Reset(chunk.ptr);
          StartOperator(this,op);
          pGVar4 = unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
                   ::operator*(&op->op_state);
          this_01 = vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
                    ::operator[](&this->intermediate_states,this->flushing_idx);
          pOVar5 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                   ::operator*(this_01);
          op_00 = (PhysicalOperator *)&this->context;
          iVar2 = (*op->_vptr_PhysicalOperator[0xb])(op,&this->context,chunk.ptr,pGVar4,pOVar5);
          EndOperator(this,op_00,chunk);
          bVar6 = (char)iVar2 == '\0';
          value = ExecutePushInternal(this,chunk.ptr,chunk_budget,this->flushing_idx + 1);
        }
        else {
          value = ExecutePushInternal(this,chunk.ptr,chunk_budget,this->flushing_idx + 1);
          bVar6 = true;
        }
        this->should_flush_current_idx = bVar6;
        if (value != NEED_MORE_INPUT) {
          if (value != HAVE_MORE_OUTPUT) {
            if (value == FINISHED) {
              return true;
            }
            if (value != BLOCKED) {
              this_02 = (InternalException *)__cxa_allocate_exception(0x10);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,
                         "Unexpected OperatorResultType (%s) in TryFlushCachingOperators","");
              EnumUtil::ToString<duckdb::OperatorResultType>(&local_50,value);
              InternalException::InternalException<std::__cxx11::string>
                        (this_02,&local_70,&local_50);
              __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            this->remaining_sink_chunk = true;
          }
          return false;
        }
        __n_00 = this->flushing_idx;
      }
      pPVar1 = this->pipeline;
    } while (__n_00 < (ulong)((long)(pPVar1->operators).
                                    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    .
                                    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pPVar1->operators).
                                    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    .
                                    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return true;
}

Assistant:

bool PipelineExecutor::TryFlushCachingOperators(ExecutionBudget &chunk_budget) {
	if (!started_flushing) {
		// Remainder of this method assumes any in process operators are from flushing
		D_ASSERT(in_process_operators.empty());
		started_flushing = true;
		flushing_idx = IsFinished() ? idx_t(finished_processing_idx) : 0;
	}

	// For each operator that supports FinalExecute,
	// extract every chunk from it and push it through the rest of the pipeline
	// before moving onto the next operators' FinalExecute
	while (flushing_idx < pipeline.operators.size()) {
		if (!pipeline.operators[flushing_idx].get().RequiresFinalExecute()) {
			flushing_idx++;
			continue;
		}

		// This slightly awkward way of increasing the flushing idx is to make the code re-entrant: We need to call this
		// method again in the case of a Sink returning BLOCKED.
		if (!should_flush_current_idx && in_process_operators.empty()) {
			should_flush_current_idx = true;
			flushing_idx++;
			continue;
		}

		auto &curr_chunk =
		    flushing_idx + 1 >= intermediate_chunks.size() ? final_chunk : *intermediate_chunks[flushing_idx + 1];
		auto &current_operator = pipeline.operators[flushing_idx].get();

		OperatorFinalizeResultType finalize_result;

		if (in_process_operators.empty()) {
			curr_chunk.Reset();
			StartOperator(current_operator);
			finalize_result = current_operator.FinalExecute(context, curr_chunk, *current_operator.op_state,
			                                                *intermediate_states[flushing_idx]);
			EndOperator(current_operator, &curr_chunk);
		} else {
			// Reset flag and reflush the last chunk we were flushing.
			finalize_result = OperatorFinalizeResultType::HAVE_MORE_OUTPUT;
		}

		auto push_result = ExecutePushInternal(curr_chunk, chunk_budget, flushing_idx + 1);

		if (finalize_result == OperatorFinalizeResultType::HAVE_MORE_OUTPUT) {
			should_flush_current_idx = true;
		} else {
			should_flush_current_idx = false;
		}

		switch (push_result) {
		case OperatorResultType::BLOCKED: {
			remaining_sink_chunk = true;
			return false;
		}
		case OperatorResultType::HAVE_MORE_OUTPUT: {
			D_ASSERT(chunk_budget.IsDepleted());
			// The chunk budget was used up, pushing the chunk through the pipeline created more chunks
			// we need to continue this the next time Execute is called.
			return false;
		}
		case OperatorResultType::NEED_MORE_INPUT:
			continue;
		case OperatorResultType::FINISHED:
			break;
		default:
			throw InternalException("Unexpected OperatorResultType (%s) in TryFlushCachingOperators",
			                        EnumUtil::ToString(push_result));
		}
		break;
	}
	return true;
}